

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_return::translate
          (method_return *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Elt_pointer pdVar3;
  token_base *ptVar4;
  int iVar5;
  statement_base *psVar6;
  const_reference pptVar7;
  undefined4 extraout_var;
  _Elt_pointer pptVar8;
  
  psVar6 = (statement_base *)statement_base::operator_new((statement_base *)0x28,(size_t)context);
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  iVar5 = tree_type<cs::token_base_*>::copy
                    ((EVP_PKEY_CTX *)(*pptVar7)[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
  peVar1 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  pdVar3 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar8 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar8 ==
      (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar8 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar4 = pptVar8[-1];
  (psVar6->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (psVar6->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  psVar6->line_num = ptVar4->line_num;
  psVar6->_vptr_statement_base = (_func_int **)&PTR__statement_return_0032b568;
  psVar6[1]._vptr_statement_base = (_func_int **)CONCAT44(extraout_var,iVar5);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  return psVar6;
}

Assistant:

statement_base *
	method_return::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		return new statement_return(static_cast<token_expr *>(raw.front().at(1))->get_tree(), context,
		                            raw.front().back());
	}